

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

BOOLEAN __thiscall BVStatic<65536UL>::TestAndSetInterlocked(BVStatic<65536UL> *this,BVIndex i)

{
  byte *pbVar1;
  byte bVar2;
  BVIndex i_local;
  BVStatic<65536UL> *this_local;
  uchar retval;
  
  AssertRange(this,i);
  LOCK();
  pbVar1 = (byte *)((long)&this->data[0].word + ((long)(int)i >> 3));
  bVar2 = *pbVar1;
  *pbVar1 = *pbVar1 | '\x01' << (i & 7);
  UNLOCK();
  return (bVar2 >> (i & 7) & 1) != 0;
}

Assistant:

BOOLEAN TestAndSetInterlocked(BVIndex i)
    {
        AssertRange(i);
        return PlatformAgnostic::_InterlockedBitTestAndSet((LONG *)this->data, (LONG) i);
    }